

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPOMDPPlanner.cpp
# Opt level: O2

QFunctionsDiscrete * __thiscall
MonahanPOMDPPlanner::BackupStage
          (QFunctionsDiscrete *__return_storage_ptr__,MonahanPOMDPPlanner *this,
          QFunctionsDiscrete *Q,size_t maxNrAlphas)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  PlanningUnitDecPOMDPDiscrete *pPVar5;
  ostream *poVar6;
  size_t sVar7;
  long lVar8;
  GaoVectorSetIndex a;
  size_type sVar9;
  long lVar10;
  ValueFunctionPOMDPDiscrete local_c8;
  GaoVectorSet G;
  
  pPVar5 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
  if (pPVar5 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar5 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
  }
  iVar4 = (**(code **)((long)*(pPVar5->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,(long)iVar4,(allocator_type *)&G);
  AlphaVectorPlanning::QFunctionsToValueFunction(&local_c8,Q);
  AlphaVectorPlanning::BackProject(&G,(AlphaVectorPlanning *)this,&local_c8);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_c8);
  std::operator<<((ostream *)&std::cout,"MonahanPOMDPPlanner::BackupStage <");
  std::ostream::flush();
  lVar8 = 8;
  lVar10 = 0;
  for (sVar9 = 0; (long)iVar4 != sVar9; sVar9 = sVar9 + 1) {
    MonahanCrossSum(this,&G,__return_storage_ptr__,(Index)sVar9,
                    (this->super_MonahanPlanner)._m_doIncPrune,maxNrAlphas);
    pvVar1 = (__return_storage_ptr__->
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)((long)&(pvVar1->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)
                             ._M_impl.super__Vector_impl_data + lVar8);
    lVar3 = *(long *)((long)pvVar1 + lVar8 + -8);
    poVar6 = std::operator<<((ostream *)&std::cout," ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::ostream::flush();
    sVar7 = MonahanPlanner::GetNrVectors(&this->super_MonahanPlanner);
    lVar10 = lVar10 + (lVar2 - lVar3) / 0x28;
    MonahanPlanner::CheckMaxNrVectors(&this->super_MonahanPlanner,maxNrAlphas,sVar7 + lVar10);
    lVar8 = lVar8 + 0x18;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,">");
  std::endl<char,std::char_traits<char>>(poVar6);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(&G);
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete 
MonahanPOMDPPlanner::BackupStage(const QFunctionsDiscrete &Q,
                                 size_t maxNrAlphas)
{
    int nrA=GetPU()->GetNrJointActions();
    QFunctionsDiscrete Q1(nrA);

    GaoVectorSet G=BackProject(QFunctionsToValueFunction(Q));

    size_t nrVectorsComputed=0;

    // Do the cross-sums, results are stored in V1
    cout << "MonahanPOMDPPlanner::BackupStage <"; cout.flush();
    for(GaoVectorSetIndex a=0;a!=nrA;a++)
    {
        MonahanCrossSum(G,Q1,a,_m_doIncPrune,maxNrAlphas);
        nrVectorsComputed+=Q1[a].size();
        cout << " " << Q1[a].size(); cout.flush();
        CheckMaxNrVectors(maxNrAlphas,GetNrVectors()+nrVectorsComputed);
    }
    cout << ">" << endl;
    return(Q1);
}